

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::VisibilityGroup> *
metaf::VisibilityGroup::parse(string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int in_EDX;
  VisibilityGroup *in_RDI;
  optional<metaf::VisibilityGroup> *v;
  VisibilityGroup result;
  optional<metaf::Distance> v_2;
  IncompleteText in_stack_fffffffffffffd38;
  Type in_stack_fffffffffffffd3c;
  VisibilityGroup *this;
  string *in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe60;
  string *in_stack_ffffffffffffff90;
  
  this = in_RDI;
  if (in_EDX == 4) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                    in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    if (bVar1) {
      VisibilityGroup(this,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
  }
  if ((in_EDX == 2) || (in_EDX == 3)) {
    fromIncompleteInteger(in_stack_fffffffffffffdb0);
    bVar1 = std::optional<metaf::VisibilityGroup>::has_value
                      ((optional<metaf::VisibilityGroup> *)0x2551d6);
    if (bVar1) {
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    fromMeters(in_stack_fffffffffffffe60);
    bVar1 = std::optional<metaf::VisibilityGroup>::has_value
                      ((optional<metaf::VisibilityGroup> *)0x2551fd);
    if (bVar1) {
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
    Distance::fromMileString(in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f);
    bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x255226);
    if (bVar1) {
      VisibilityGroup(this);
      std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x255240);
      std::optional<metaf::VisibilityGroup>::optional<metaf::VisibilityGroup,_true>
                ((optional<metaf::VisibilityGroup> *)this,
                 (VisibilityGroup *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
  }
  if (in_EDX == 2) {
    fromRvr(in_stack_ffffffffffffff90);
    bVar1 = std::optional<metaf::VisibilityGroup>::has_value
                      ((optional<metaf::VisibilityGroup> *)0x25528a);
    if (bVar1) {
      return (optional<metaf::VisibilityGroup> *)in_RDI;
    }
  }
  std::optional<metaf::VisibilityGroup>::optional((optional<metaf::VisibilityGroup> *)0x25529e);
  return (optional<metaf::VisibilityGroup> *)in_RDI;
}

Assistant:

std::optional<VisibilityGroup> VisibilityGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::RMK) {
		if (group == "VIS") 
			return VisibilityGroup(Type::PREVAILING, IncompleteText::VIS);
		if (group == "SFC")
			return VisibilityGroup(Type::SURFACE, IncompleteText::SFC_OR_TWR);
		if (group == "TWR")
			return VisibilityGroup(Type::TOWER, IncompleteText::SFC_OR_TWR);
		if (group == "RVRNO") 
			return VisibilityGroup(Type::RVRNO, IncompleteText::NONE);
		if (group == "VISNO") 
			return VisibilityGroup(Type::VISNO, IncompleteText::VISNO);
		if (group == "RVR") 
			return VisibilityGroup(Type::RVR_MISG, IncompleteText::RVR);
	}
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF) {
		if (const auto v = fromIncompleteInteger(group); v.has_value()) return v;
		if (const auto v = fromMeters(group); v.has_value()) return v;
		if (const auto v = Distance::fromMileString(group); v.has_value()) {
			VisibilityGroup result;
			result.vis = *v;
			return result;
		}
	}
	if (reportPart == ReportPart::METAR) {
		if (const auto v = fromRvr(group); v.has_value()) return v;
	}
	return std::optional<VisibilityGroup>();
}